

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu.c
# Opt level: O2

RK_U32 VPUCheckSupportWidth(void)

{
  int socket;
  RK_S32 RVar1;
  RK_U32 RVar2;
  VPUHwDecConfig_t hwCfg;
  
  RVar2 = 0;
  socket = open("/dev/vpu_service",0x80002);
  if ((-1 < socket) || (socket = open("/dev/vpu-service",0x80002), -1 < socket)) {
    hwCfg.avsSupport = 0;
    hwCfg.rvSupport = 0;
    hwCfg.mvcSupport = 0;
    hwCfg.jpegESupport = 0;
    hwCfg.vp8Support = 0;
    hwCfg.vp6Support = 0;
    hwCfg.vp7Support = 0;
    hwCfg.sorensonSparkSupport = 0;
    hwCfg.refBufSupport = 0;
    hwCfg.ppSupport = 0;
    hwCfg.ppConfig = 0;
    hwCfg.vc1Support = 0;
    hwCfg.mpeg2Support = 0;
    hwCfg.mpeg4Support = 0;
    hwCfg.customMpeg4Support = 0;
    hwCfg.h264Support = 0;
    hwCfg.jpegSupport = 0;
    hwCfg.maxDecPicWidth = 0;
    hwCfg.maxPpOutPicWidth = 0;
    RVar1 = VPUClientGetHwCfg(socket,&hwCfg.maxDecPicWidth,0x4c);
    if (RVar1 == 0) {
      close(socket);
      RVar2 = hwCfg.maxDecPicWidth;
    }
    else {
      _mpp_log_l(2,"vpu","Get HwCfg failed\n","VPUCheckSupportWidth");
      close(socket);
      RVar2 = 0xffffffff;
    }
  }
  return RVar2;
}

Assistant:

RK_U32 VPUCheckSupportWidth()
{
    VPUHwDecConfig_t hwCfg;
    int fd = -1;
    fd = open("/dev/vpu_service", O_RDWR | O_CLOEXEC);
    if (fd < 0) {
        fd = open("/dev/vpu-service", O_RDWR | O_CLOEXEC);
    }
    memset(&hwCfg, 0, sizeof(VPUHwDecConfig_t));
    if (fd >= 0) {
        if (VPUClientGetHwCfg(fd, (RK_U32*)&hwCfg, sizeof(hwCfg))) {
            mpp_err_f("Get HwCfg failed\n");
            close(fd);
            return -1;
        }
        close(fd);
        fd = -1;
    }
    return hwCfg.maxDecPicWidth;
}